

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O2

void __thiscall Encode::calcProbabilities(Encode *this)

{
  pointer pcVar1;
  difference_type dVar2;
  long lVar3;
  vector<char,_std::allocator<char>_> *__range1;
  char *i;
  _Iter_equals_val<const_char> __pred;
  undefined1 auVar4 [16];
  vector<char,_std::allocator<char>_> tmp;
  _Vector_base<char,_std::allocator<char>_> local_48;
  double local_30;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (char *)0x0;
  std::
  unique_copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,(vector<char,_std::allocator<char>_> *)&local_48);
  pcVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (__pred._M_value = local_48._M_impl.super__Vector_impl_data._M_start;
      __pred._M_value != pcVar1; __pred._M_value = __pred._M_value + 1) {
    dVar2 = std::
            __count_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                       (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                       (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,__pred);
    lVar3 = (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    local_30 = (double)(int)dVar2 /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_probabilities,&local_30);
  }
  std::vector<char,_std::allocator<char>_>::operator=
            (&this->m_data,(vector<char,_std::allocator<char>_> *)&local_48);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void calcProbabilities() {
        sort(m_data.begin(), m_data.end());
        vector<char> tmp;
        unique_copy(m_data.begin(), m_data.end(), back_inserter(tmp));
        for (auto &i : tmp) {
            int countElements = count(m_data.begin(), m_data.end(), i);
            m_probabilities.push_back((double) countElements / m_data.size());
        }
        m_data = tmp;
    }